

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_optional_asn1_bool(CBS *cbs,int *out,CBS_ASN1_TAG tag,int default_value)

{
  int iVar1;
  int iVar2;
  int present;
  CBS child2;
  CBS child;
  int local_3c;
  CBS local_38;
  CBS local_28;
  
  iVar1 = CBS_get_optional_asn1(cbs,&local_28,&local_3c,tag);
  iVar2 = 0;
  if (iVar1 != 0) {
    if (local_3c != 0) {
      iVar1 = cbs_get_asn1(&local_28,&local_38,1,1);
      if (iVar1 == 0) {
        return 0;
      }
      if (local_38.len != 1) {
        return 0;
      }
      if (local_28.len != 0) {
        return 0;
      }
      default_value = (int)*local_38.data;
      if (*local_38.data != 0) {
        if (default_value != 0xff) {
          return 0;
        }
        default_value = 1;
      }
    }
    *out = default_value;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CBS_get_optional_asn1_bool(CBS *cbs, int *out, CBS_ASN1_TAG tag,
                               int default_value) {
  CBS child, child2;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    uint8_t boolean;

    if (!CBS_get_asn1(&child, &child2, CBS_ASN1_BOOLEAN) ||
        CBS_len(&child2) != 1 || CBS_len(&child) != 0) {
      return 0;
    }

    boolean = CBS_data(&child2)[0];
    if (boolean == 0) {
      *out = 0;
    } else if (boolean == 0xff) {
      *out = 1;
    } else {
      return 0;
    }
  } else {
    *out = default_value;
  }
  return 1;
}